

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O3

Result wabt::ParseWatModule
                 (WastLexer *lexer,
                 unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *out_module,
                 Errors *errors,WastParseOptions *options)

{
  Result RVar1;
  Result RVar2;
  WastParser parser;
  WastParser local_c0;
  
  if (out_module == (unique_ptr<wabt::Module,_std::default_delete<wabt::Module>_> *)0x0) {
    __assert_fail("out_module != nullptr",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                  ,0xbc3,
                  "Result wabt::ParseWatModule(WastLexer *, std::unique_ptr<Module> *, Errors *, WastParseOptions *)"
                 );
  }
  if (options != (WastParseOptions *)0x0) {
    local_c0.last_module_index_ = 0xffffffff;
    local_c0.tokens_.contents_._M_elems[0].loc.filename.data_ = (char *)0x0;
    local_c0.tokens_.contents_._M_elems[0].loc.filename.size_._0_4_ = 0;
    local_c0.tokens_.contents_._M_elems[0].loc.filename.size_._4_4_ = 0;
    local_c0.tokens_.contents_._M_elems[0].loc.field_1.field_0.line = 0;
    local_c0.tokens_.contents_._M_elems[0].loc.field_1._4_8_ = 0;
    local_c0.tokens_.contents_._M_elems[0].token_type_ = First;
    local_c0.tokens_.contents_._M_elems[1].loc.filename.data_ = (char *)0x0;
    local_c0.tokens_.contents_._M_elems[1].loc.filename.size_._0_4_ = 0;
    local_c0.tokens_.contents_._M_elems[1].loc.filename.size_._4_4_ = 0;
    local_c0.tokens_.contents_._M_elems[1].loc.field_1.field_0.line = 0;
    local_c0.tokens_.contents_._M_elems[1].loc.field_1._4_8_ = 0;
    local_c0.tokens_.contents_._M_elems[1].token_type_ = First;
    local_c0.tokens_.size_ = 0;
    local_c0.tokens_.front_ = 0;
    local_c0.lexer_ = lexer;
    local_c0.errors_ = errors;
    local_c0.options_ = options;
    RVar1 = WastParser::ParseModule(&local_c0,out_module);
    if (local_c0.tokens_.size_ != 0) {
      do {
        CircularArray<wabt::Token,_2UL>::pop_back(&local_c0.tokens_);
      } while (local_c0.tokens_.size_ != 0);
    }
    RVar2.enum_._1_3_ = 0;
    RVar2.enum_._0_1_ = RVar1.enum_ == Error;
    return (Result)RVar2.enum_;
  }
  __assert_fail("options != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/wast-parser.cc"
                ,0xbc4,
                "Result wabt::ParseWatModule(WastLexer *, std::unique_ptr<Module> *, Errors *, WastParseOptions *)"
               );
}

Assistant:

Result ParseWatModule(WastLexer* lexer,
                      std::unique_ptr<Module>* out_module,
                      Errors* errors,
                      WastParseOptions* options) {
  assert(out_module != nullptr);
  assert(options != nullptr);
  WastParser parser(lexer, errors, options);
  CHECK_RESULT(parser.ParseModule(out_module));
  return Result::Ok;
}